

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_collector.cpp
# Opt level: O0

void __thiscall
duckdb::BufferedCollectorLocalState::~BufferedCollectorLocalState(BufferedCollectorLocalState *this)

{
  void *in_RDI;
  
  ~BufferedCollectorLocalState((BufferedCollectorLocalState *)0x17f5188);
  operator_delete(in_RDI);
  return;
}

Assistant:

SinkResultType PhysicalBufferedCollector::Sink(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<BufferedCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<BufferedCollectorLocalState>();
	(void)lstate;

	lock_guard<mutex> l(gstate.glock);
	auto &buffered_data = gstate.buffered_data->Cast<SimpleBufferedData>();

	if (buffered_data.BufferIsFull()) {
		auto callback_state = input.interrupt_state;
		buffered_data.BlockSink(callback_state);
		return SinkResultType::BLOCKED;
	}
	buffered_data.Append(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}